

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O2

Range bssl::FirstUnmarkedRangeInByte(uint8_t b)

{
  size_t sVar1;
  size_t sVar2;
  undefined3 in_register_00000039;
  Range RVar3;
  
  sVar1 = 0;
  while ((sVar2 = sVar1, sVar1 != 8 &&
         ((CONCAT31(in_register_00000039,b) >> ((uint)sVar1 & 0x1f) & 1) != 0))) {
    sVar1 = sVar1 + 1;
  }
  while ((sVar2 != 8 && ((CONCAT31(in_register_00000039,b) >> ((uint)sVar2 & 0x1f) & 1) == 0))) {
    sVar2 = sVar2 + 1;
  }
  RVar3.end = sVar2;
  RVar3.start = sVar1;
  return RVar3;
}

Assistant:

static DTLSMessageBitmap::Range FirstUnmarkedRangeInByte(uint8_t b) {
  size_t start, end;
  for (start = 0; start < 8; start++) {
    if ((b & (1u << start)) == 0) {
      break;
    }
  }
  for (end = start; end < 8; end++) {
    if ((b & (1u << end)) != 0) {
      break;
    }
  }
  return DTLSMessageBitmap::Range{start, end};
}